

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O2

void __thiscall
ThreadParser::SAX2Handler::startElement
          (SAX2Handler *this,XMLCh *param_1,XMLCh *localname,XMLCh *param_3,Attributes *attributes)

{
  long lVar1;
  XMLCh *pXVar2;
  long lVar3;
  
  addToCheckSum(this->SAX2Instance,localname,0xffffffffffffffff);
  lVar1 = (**(code **)(*(long *)attributes + 0x10))(attributes);
  for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
    pXVar2 = (XMLCh *)(**(code **)(*(long *)attributes + 0x28))(attributes,lVar3);
    addToCheckSum(this->SAX2Instance,pXVar2,0xffffffffffffffff);
    pXVar2 = (XMLCh *)(**(code **)(*(long *)attributes + 0x38))(attributes,lVar3);
    addToCheckSum(this->SAX2Instance,pXVar2,0xffffffffffffffff);
  }
  return;
}

Assistant:

void ThreadParser::SAX2Handler::startElement(const XMLCh *const /*uri*/,
                              const XMLCh *const localname,
                              const XMLCh *const /*qname*/,
                              const Attributes& attributes)
{
    SAX2Instance->addToCheckSum(localname);

    XMLSize_t n = attributes.getLength();
    XMLSize_t i;
    for (i=0; i<n; i++)
    {
        const XMLCh *attNam = attributes.getQName(i);
        SAX2Instance->addToCheckSum(attNam);
        const XMLCh *attVal = attributes.getValue(i);
        SAX2Instance->addToCheckSum(attVal);
    }
}